

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O1

ze_result_t
validation_layer::zeImageCreate
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_image_desc_t *desc,
          ze_image_handle_t *phImage)

{
  long lVar1;
  code *pcVar2;
  long lVar3;
  long *plVar4;
  ze_result_t zVar5;
  ze_result_t result;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  ze_result_t local_94;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar6 = context;
  uVar9 = *(ulong *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zeImageCreate(hContext, hDevice, desc, phImage)","");
  if (*(char *)(uVar9 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(uVar9 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar2 = *(code **)(lVar6 + 0x380);
  if (pcVar2 == (code *)0x0) {
    zVar5 = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar3 = *(long *)(lVar6 + 0xd30);
    lVar6 = *(long *)(lVar6 + 0xd38);
    uVar8 = lVar6 - lVar3 >> 3;
    bVar10 = lVar6 != lVar3;
    if (bVar10) {
      uVar7 = 1;
      do {
        plVar4 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + -8 + uVar7 * 8);
        zVar5 = (**(code **)(*plVar4 + 0x580))(plVar4,hContext,hDevice,desc,phImage);
        if (zVar5 != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeImageCreate",zVar5);
          uVar9 = (ulong)zVar5;
          break;
        }
        bVar10 = uVar7 < uVar8;
        lVar1 = (-(ulong)(uVar8 == 0) - uVar8) + uVar7;
        uVar7 = uVar7 + 1;
      } while (lVar1 != 0);
    }
    lVar1 = context;
    local_94 = (ze_result_t)uVar9;
    if (bVar10) {
      return local_94;
    }
    if ((*(char *)(context + 4) == '\x01') &&
       (zVar5 = ZEHandleLifetimeValidation::zeImageCreatePrologue
                          (*(ZEHandleLifetimeValidation **)(context + 0xd48),hContext,hDevice,desc,
                           phImage), zVar5 != ZE_RESULT_SUCCESS)) {
      logAndPropagateResult("zeImageCreate",zVar5);
      return zVar5;
    }
    zVar5 = (*pcVar2)(hContext,hDevice,desc,phImage);
    bVar10 = lVar6 != lVar3;
    if (bVar10) {
      uVar9 = 1;
      do {
        plVar4 = (long *)**(undefined8 **)(*(long *)(lVar1 + 0xd30) + -8 + uVar9 * 8);
        result = (**(code **)(*plVar4 + 0x588))(plVar4,hContext,hDevice,desc,phImage,zVar5);
        if (result != ZE_RESULT_SUCCESS) {
          logAndPropagateResult("zeImageCreate",result);
          local_94 = result;
          break;
        }
        bVar10 = uVar9 < uVar8;
        lVar6 = (-(ulong)(uVar8 == 0) - uVar8) + uVar9;
        uVar9 = uVar9 + 1;
      } while (lVar6 != 0);
    }
    if (bVar10) {
      return local_94;
    }
    if (((zVar5 == ZE_RESULT_SUCCESS) && (phImage != (ze_image_handle_t *)0x0)) &&
       (*(char *)(lVar1 + 4) != '\0')) {
      HandleLifetimeValidation::addHandle(*(HandleLifetimeValidation **)(lVar1 + 0xd48),*phImage);
      HandleLifetimeValidation::addDependent
                (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hContext,*phImage);
    }
  }
  logAndPropagateResult("zeImageCreate",zVar5);
  return zVar5;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeImageCreate(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        const ze_image_desc_t* desc,                    ///< [in] pointer to image descriptor
        ze_image_handle_t* phImage                      ///< [out] pointer to handle of image object created
        )
    {
        context.logger->log_trace("zeImageCreate(hContext, hDevice, desc, phImage)");

        auto pfnCreate = context.zeDdiTable.Image.pfnCreate;

        if( nullptr == pfnCreate )
            return logAndPropagateResult("zeImageCreate", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeImageCreatePrologue( hContext, hDevice, desc, phImage );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeImageCreate", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeImageCreatePrologue( hContext, hDevice, desc, phImage );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeImageCreate", result);
        }

        auto driver_result = pfnCreate( hContext, hDevice, desc, phImage );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeImageCreateEpilogue( hContext, hDevice, desc, phImage ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeImageCreate", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            if (phImage){
                context.handleLifetime->addHandle( *phImage );
                context.handleLifetime->addDependent( hContext, *phImage );

            }
        }
        return logAndPropagateResult("zeImageCreate", driver_result);
    }